

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O2

RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *
capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise
          (RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>
           *__return_storage_ptr__,
          Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
          *promise)

{
  SourceLocation location;
  PipelineHook *pPVar1;
  TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
  TVar2;
  Tuple<kj::Promise<Response<GetCapResults>_>,_kj::Promise<kj::Own<PipelineHook>_>_> splitPromise;
  Own<capnp::PipelineHook,_std::nullptr_t> local_98;
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
  local_88;
  char *local_78;
  char *pcStack_70;
  undefined8 local_68;
  Pipeline local_60;
  Pipeline local_38;
  
  kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>::
  then<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise(kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>&&)::_lambda(capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>&&)_1_>
            ((Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>
              *)&local_38,(anon_class_1_0_00000001_for_func *)promise);
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.h"
  ;
  pcStack_70 = "reducePromise";
  local_68 = 0x700000428;
  location.function = "reducePromise";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.h"
  ;
  location.lineNumber = 0x428;
  location.columnNumber = 7;
  kj::
  Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
  ::split((Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
           *)&local_88,location);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_38);
  newLocalPromisePipeline
            ((capnp *)&local_98,
             &local_88.
              super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>.
              value);
  TVar2.value.super_PromiseBase.node.ptr =
       local_88.
       super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
       .value.super_PromiseBase.node.ptr;
  pPVar1 = local_98.ptr;
  local_60.hook.disposer = local_98.disposer;
  local_98.ptr = (PipelineHook *)0x0;
  local_60.ops.disposer = (ArrayDisposer *)0x0;
  local_38.hook.disposer = local_98.disposer;
  local_60.hook.ptr = (PipelineHook *)0x0;
  local_38.ops.disposer = (ArrayDisposer *)0x0;
  local_88.
  super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
  .value.super_PromiseBase.node.ptr =
       (Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>)
       (PromiseBase)0x0;
  local_60.ops.ptr = (PipelineOp *)0x0;
  local_60.ops.size_ = 0;
  (__return_storage_ptr__->
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>).
  super_PromiseBase.node.ptr = (PromiseNode *)TVar2.value.super_PromiseBase.node.ptr;
  (__return_storage_ptr__->super_Pipeline)._typeless.hook.disposer = local_98.disposer;
  (__return_storage_ptr__->super_Pipeline)._typeless.hook.ptr = pPVar1;
  local_38.hook.ptr = (PipelineHook *)0x0;
  (__return_storage_ptr__->super_Pipeline)._typeless.ops.ptr = (PipelineOp *)0x0;
  (__return_storage_ptr__->super_Pipeline)._typeless.ops.size_ = 0;
  (__return_storage_ptr__->super_Pipeline)._typeless.ops.disposer = (ArrayDisposer *)0x0;
  local_38.ops.ptr = (PipelineOp *)0x0;
  local_38.ops.size_ = 0;
  AnyPointer::Pipeline::~Pipeline(&local_38);
  AnyPointer::Pipeline::~Pipeline(&local_60);
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose(&local_98);
  kj::_::
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
  ::~TupleImpl(&local_88);
  return __return_storage_ptr__;
}

Assistant:

RemotePromise<T> RemotePromise<T>::reducePromise(kj::Promise<RemotePromise>&& promise) {
  kj::Tuple<kj::Promise<Response<T>>, kj::Promise<kj::Own<PipelineHook>>> splitPromise =
      promise.then([](RemotePromise&& inner) {
    // `inner` is multiply-inherited, and we want to move away each superclass separately.
    // Let's create two references to make clear what we're doing (though this is not strictly
    // necessary).
    kj::Promise<Response<T>>& innerPromise = inner;
    typename T::Pipeline& innerPipeline = inner;
    return kj::tuple(kj::mv(innerPromise), PipelineHook::from(kj::mv(innerPipeline)));
  }).split();

  return RemotePromise(kj::mv(kj::get<0>(splitPromise)),
      typename T::Pipeline(AnyPointer::Pipeline(
          newLocalPromisePipeline(kj::mv(kj::get<1>(splitPromise))))));
}